

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O2

void duckdb::BitpackingPrimitives::PackBuffer<duckdb::hugeint_t,false>
               (data_ptr_t dst,hugeint_t *src,idx_t count,bitpacking_width_t width)

{
  undefined3 in_register_00000009;
  ulong uVar1;
  uhugeint_t *in;
  ulong uVar2;
  ulong uVar3;
  hugeint_t tmp_buffer [32];
  uhugeint_t local_238;
  undefined1 local_228 [504];
  
  uVar2 = count & 0xffffffffffffffe0;
  uVar3 = 0;
  in = (uhugeint_t *)src;
  for (uVar1 = 0; uVar1 < uVar2; uVar1 = uVar1 + 0x20) {
    HugeIntPacker::Pack(in,(uint32_t *)(dst + (uVar3 >> 3)),width);
    uVar3 = uVar3 + (CONCAT31(in_register_00000009,width) << 5);
    in = in + 0x20;
  }
  if ((count & 0x1f) != 0) {
    hugeint_t::hugeint_t((hugeint_t *)&local_238,0);
    switchD_016d8eb1::default(local_228,0,0x1f0);
    switchD_016b45db::default(&local_238,src + uVar2,(ulong)(uint)((int)(count & 0x1f) << 4));
    HugeIntPacker::Pack(&local_238,
                        (uint32_t *)(dst + (CONCAT31(in_register_00000009,width) * uVar2 >> 3)),
                        width);
  }
  return;
}

Assistant:

inline static void PackBuffer(data_ptr_t dst, T *src, idx_t count, bitpacking_width_t width) {
		if (ASSUME_INPUT_ALIGNED) {
			for (idx_t i = 0; i < count; i += BITPACKING_ALGORITHM_GROUP_SIZE) {
				PackGroup<T>(dst + (i * width) / 8, src + i, width);
			}
		} else {
			idx_t misaligned_count = count % BITPACKING_ALGORITHM_GROUP_SIZE;
			count -= misaligned_count;
			for (idx_t i = 0; i < count; i += BITPACKING_ALGORITHM_GROUP_SIZE) {
				PackGroup<T>(dst + (i * width) / 8, src + i, width);
			}

			// The input is not aligned to BITPACKING_ALGORITHM_GROUP_SIZE.
			// Copy the unaligned count into a zero-initialized temporary group, and pack it.
			if (misaligned_count) {
				T tmp_buffer[BITPACKING_ALGORITHM_GROUP_SIZE] = {0};
				memcpy(tmp_buffer, src + count, misaligned_count * sizeof(T));
				PackGroup<T>(dst + (count * width) / 8, tmp_buffer, width);
			}
		}
	}